

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<int_const&>::operator<
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,int *rhs)

{
  lest *this_00;
  int *in_R8;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90;
  text local_70;
  bool local_49;
  result local_48;
  string *local_20;
  int *rhs_local;
  expression_lhs<const_int_&> *this_local;
  
  local_49 = **(int **)this < *rhs;
  this_00 = *(lest **)this;
  local_20 = (string *)rhs;
  rhs_local = (int *)this;
  this_local = (expression_lhs<const_int_&> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"<",&local_d1);
  std::__cxx11::string::string(local_b0,local_d0);
  to_string<int,int>(&local_90,this_00,(int *)local_b0,local_20,in_R8);
  std::__cxx11::string::string((string *)&local_70,(string *)&local_90);
  result::result<bool>(&local_48,&local_49,&local_70);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }